

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_quaternion_op.hpp
# Opt level: O1

quaternion<double> * HAXX::operator*(quaternion<double> *__x,quaternion<double> *__y)

{
  double dVar1;
  undefined1 auVar2 [16];
  quaternion<double> qVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  quaternion<double> *in_RDI;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  in_RDI->_M_real = 0.0;
  in_RDI->_M_imag_i = 0.0;
  in_RDI->_M_imag_j = 0.0;
  in_RDI->_M_imag_k = 0.0;
  qVar3 = *__x;
  auVar5._0_8_ = __y->_M_real;
  auVar5._8_8_ = __y->_M_imag_i;
  auVar2._0_8_ = __y->_M_imag_j;
  auVar2._8_8_ = __y->_M_imag_k;
  auVar7 = vshufpd_avx((undefined1  [32])qVar3,(undefined1  [32])qVar3,0xb);
  auVar8 = vpermpd_avx2((undefined1  [32])qVar3,0x7a);
  auVar10 = vpermpd_avx2((undefined1  [32])*__y,1);
  auVar9._0_8_ = auVar7._0_8_ * auVar10._0_8_;
  auVar9._8_8_ = auVar7._8_8_ * auVar10._8_8_;
  auVar9._16_8_ = auVar7._16_8_ * auVar10._16_8_;
  auVar9._24_8_ = auVar7._24_8_ * auVar10._24_8_;
  auVar4 = vshufpd_avx(auVar5,auVar2,1);
  auVar10._16_16_ = auVar4;
  auVar10._0_16_ = auVar2;
  auVar6 = vfmadd213pd_fma(auVar10,auVar8,auVar9);
  auVar7 = vpermpd_avx2((undefined1  [32])qVar3,0x9f);
  auVar4 = vunpckhpd_avx(auVar2,auVar5);
  auVar5 = vshufpd_avx(auVar2,auVar2,1);
  auVar8._0_8_ = auVar5._0_8_ * auVar7._0_8_;
  auVar8._8_8_ = auVar5._8_8_ * auVar7._8_8_;
  auVar8._16_8_ = auVar4._0_8_ * auVar7._16_8_;
  auVar8._24_8_ = auVar4._8_8_ * auVar7._24_8_;
  dVar1 = __x->_M_real;
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  auVar7._16_8_ = dVar1;
  auVar7._24_8_ = dVar1;
  auVar7 = vfmsub231pd_avx512vl(auVar8,(undefined1  [32])*__y,auVar7);
  in_RDI->_M_real = auVar7._0_8_ + -auVar6._0_8_;
  in_RDI->_M_imag_i = auVar7._8_8_ + auVar6._8_8_;
  in_RDI->_M_imag_j = auVar7._16_8_ + 0.0;
  in_RDI->_M_imag_k = auVar7._24_8_ + 0.0;
  return in_RDI;
}

Assistant:

inline quaternion<double> operator*(const quaternion<double>& __x,
    const quaternion<double>& __y) {
  
    quaternion<double> __r;
  
    // Load x,y into 256-bit vector lanes and perform the multiplication
    __m256d x = LOAD_256D_UNALIGNED_AS(double,&__x);
    __m256d y = LOAD_256D_UNALIGNED_AS(double,&__y);
    __m256d r = MULDQ_NN(x,y);
  
    STORE_256D_UNALIGNED_AS(double,&__r,r);
    
    return __r;
  }